

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void flush_before_commit_test(void)

{
  fdb_status fVar1;
  size_t metalen;
  void *meta;
  fdb_file_handle *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  fdb_isolation_level_t in_stack_fffffffffffffa47;
  fdb_file_handle *in_stack_fffffffffffffa48;
  fdb_commit_opt_t in_stack_fffffffffffffa57;
  fdb_file_handle *in_stack_fffffffffffffa58;
  size_t in_stack_fffffffffffffa60;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle *db_txn;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 5;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  fconfig.wal_threshold._0_1_ = 1;
  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
           (fdb_config *)fconfig.log_msg_level);
  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
           (fdb_config *)fconfig.log_msg_level);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             &in_stack_fffffffffffffa38->root,(fdb_kvs_config *)0x11800d);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             &in_stack_fffffffffffffa38->root,(fdb_kvs_config *)0x118021);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"flush_before_commit_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xdba);
    flush_before_commit_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xdba,"void flush_before_commit_test()");
    }
  }
  for (n = 0; n < 0x1e; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x118171;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa48,
                   (void *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                   (size_t)in_stack_fffffffffffffa38,meta,metalen,(void *)0x1181a8,
                   in_stack_fffffffffffffa60);
  }
  fdb_begin_transaction(in_stack_fffffffffffffa48,in_stack_fffffffffffffa47);
  for (n = 0; n < 2; n = n + 1) {
    fdb_set(db_txn,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  for (n = 0; n < 2; n = n + 1) {
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_end_transaction(in_stack_fffffffffffffa58,in_stack_fffffffffffffa57);
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  fdb_begin_transaction(in_stack_fffffffffffffa48,in_stack_fffffffffffffa47);
  for (n = 0; n < 2; n = n + 1) {
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_end_transaction(in_stack_fffffffffffffa58,in_stack_fffffffffffffa57);
  for (n = 0; n < 2; n = n + 1) {
    fdb_set(db_txn,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  fdb_begin_transaction(in_stack_fffffffffffffa48,in_stack_fffffffffffffa47);
  for (n = 0; n < 2; n = n + 1) {
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  for (n = 0; n < 2; n = n + 1) {
    fdb_set(db_txn,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  fdb_end_transaction(in_stack_fffffffffffffa58,in_stack_fffffffffffffa57);
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  fdb_begin_transaction(in_stack_fffffffffffffa48,in_stack_fffffffffffffa47);
  for (n = 0; n < 2; n = n + 1) {
    fdb_set(db_txn,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  for (n = 0; n < 2; n = n + 1) {
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_end_transaction(in_stack_fffffffffffffa58,in_stack_fffffffffffffa57);
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  fdb_commit(in_stack_fffffffffffffa38,'\0');
  fdb_begin_transaction(in_stack_fffffffffffffa48,in_stack_fffffffffffffa47);
  for (n = 0; n < 10; n = n + 1) {
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  for (n = 10; n < 0x14; n = n + 1) {
    fdb_set(db_txn,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_compact((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
              (char *)in_stack_fffffffffffffa38);
  for (n = 0x14; n < 0x19; n = n + 1) {
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_end_transaction(in_stack_fffffffffffffa58,in_stack_fffffffffffffa57);
  for (n = 0x19; n < 0x1e; n = n + 1) {
    fdb_set(db_txn,*(fdb_doc **)(&stack0xfffffffffffffa38 + (long)n * 8));
  }
  fdb_close(in_stack_fffffffffffffa38);
  fdb_close(in_stack_fffffffffffffa38);
  for (n = 0; n < 0x1e; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x118520);
  }
  fdb_shutdown();
  memleak_end();
  if (flush_before_commit_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","flush before commit test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","flush before commit test");
  }
  return;
}

Assistant:

void flush_before_commit_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile_txn;
    fdb_kvs_handle *db, *db_txn;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 5;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;
    fconfig.wal_flush_before_commit = true;

    // open db
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn, &db_txn, &kvs_config);
    status = fdb_set_log_callback(db_txn, logCallbackFunc,
                                  (void *) "flush_before_commit_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
    }

    // non-transactional commit first, transactional commit next
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // transactional commit first, non-transactional commit next
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // concurrent update (non-txn commit first, txn commit next)
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // concurrent update (txn commit first, non-txn commit next)
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);
    for (i=0;i<2;++i){
        fdb_set(db, doc[i]);
    }
    for (i=0;i<2;++i){
        fdb_set(db_txn, doc[i]);
    }
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // begin transaction
    fdb_begin_transaction(dbfile_txn, FDB_ISOLATION_READ_COMMITTED);

    // insert docs using transaction
    for (i=0;i<10;++i){
        fdb_set(db_txn, doc[i]);
    }

    // insert docs without transaction
    for (i=10;i<20;++i){
        fdb_set(db, doc[i]);
    }

    // do compaction
    fdb_compact(dbfile, "dummy2");

    for (i=20;i<25;++i){
        fdb_set(db_txn, doc[i]);
    }
    // end transaction
    fdb_end_transaction(dbfile_txn, FDB_COMMIT_NORMAL);

    for (i=25;i<30;++i){
        fdb_set(db, doc[i]);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("flush before commit test");
}